

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteCuePayload(FILE *f,FrameParser *parser)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  string line;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  iVar4 = 0;
  do {
    iVar1 = libwebvtt::LineReader::GetLine(&parser->super_LineReader,&local_48);
    if (iVar1 < 0) goto LAB_0010f1d5;
    if (local_48._M_string_length == 0) {
      bVar3 = 1;
      goto LAB_0010f1db;
    }
    uVar2 = fprintf((FILE *)f,"%s\n",local_48._M_dataplus._M_p);
    iVar4 = iVar4 + 1;
  } while (-1 < (int)uVar2);
  iVar4 = (iVar4 - ((int)~uVar2 >> 0x1f)) + -1;
LAB_0010f1d5:
  bVar3 = 0;
LAB_0010f1db:
  std::__cxx11::string::~string((string *)&local_48);
  return (bool)(0 < iVar4 & bVar3);
}

Assistant:

bool vttdemux::WriteCuePayload(FILE* f, FrameParser* parser) {
  int count = 0;  // count of lines of payload text written to output file
  for (string line;;) {
    const int e = parser->GetLine(&line);

    if (e < 0)  // error (only -- we allow EOS here)
      return false;

    if (line.empty())  // TODO(matthewjheaney): retain this check?
      break;

    if (fprintf(f, "%s\n", line.c_str()) < 0)
      return false;

    ++count;
  }

  if (count <= 0)  // WebVTT cue requires non-empty payload
    return false;

  return true;
}